

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::findStabilizationSample
          (UploadWaitDrawCase *this,offset_in_Result_to_deUint64 target,char *description)

{
  int iVar1;
  value_type vVar2;
  float fVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  iterator __first;
  iterator __last;
  reference orderedObservationsB;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  MessageBuilder local_530;
  float local_3b0;
  float local_3ac;
  MessageBuilder local_3a8;
  undefined4 local_224;
  float local_220;
  float local_21c;
  MessageBuilder local_218;
  DistributionCompareResult local_98;
  DistributionCompareResult result;
  int cmpTargetDistribution;
  int sampleNdx;
  int local_74;
  int local_70;
  int ndx;
  int insertNdx;
  int swapNdx;
  ThresholdComparer<unsigned_long> comparer;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_41;
  undefined1 local_40 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  sampleObservations;
  char *description_local;
  offset_in_Result_to_deUint64 target_local;
  UploadWaitDrawCase *this_local;
  
  iVar1 = this->m_numMaxSwaps;
  sampleObservations.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)description;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator(&local_41);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)local_40,(long)(iVar1 + 1),&local_41);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator(&local_41)
  ;
  insertNdx = 0x3e19999a;
  comparer.relativeThreshold = 1.4013e-43;
  comparer._4_4_ = 0;
  for (ndx = 0; ndx <= this->m_numMaxSwaps; ndx = ndx + 1) {
    local_70 = 0;
    pvVar4 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)local_40,(long)ndx);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar4,(long)this->m_numSamplesPerSwap);
    for (local_74 = 0;
        sVar5 = std::
                vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                ::size(&this->m_samples), local_74 < (int)sVar5; local_74 = local_74 + 1) {
      pvVar6 = std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
               ::operator[](&this->m_samples,(long)local_74);
      if (pvVar6->numFrames == ndx) {
        pvVar7 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                 ::operator[](&this->m_results,(long)local_74);
        vVar2 = *(value_type *)((long)&pvVar7->uploadDuration + target);
        pvVar4 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               *)local_40,(long)ndx);
        pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar4,(long)local_70);
        *pvVar8 = vVar2;
        local_70 = local_70 + 1;
      }
    }
    pvVar4 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)local_40,(long)ndx);
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar4);
    pvVar4 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)local_40,(long)ndx);
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar4);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last._M_current);
  }
  fVar3 = (float)this->m_numMaxSwaps;
  do {
    result.standardDeviations = (float)((int)fVar3 + -1);
    if (result.standardDeviations == -NAN) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_530,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_530,
                           (char **)&sampleObservations.
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char (*) [49])": All samples seem to have the same distribution"
                          );
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_530);
      this_local._4_4_ = 0;
LAB_00c59a97:
      local_224 = 1;
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)local_40);
      return this_local._4_4_;
    }
    while (result._0_4_ = fVar3, fVar3 = result.standardDeviations,
          (int)result._0_4_ <= this->m_numMaxSwaps) {
      pvVar4 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)local_40,(long)(int)result.standardDeviations);
      orderedObservationsB =
           std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)local_40,(long)(int)result._0_4_);
      local_98 = Performance::(anonymous_namespace)::
                 distributionCompare<deqp::gles3::Performance::(anonymous_namespace)::ThresholdComparer<unsigned_long>>
                           (pvVar4,orderedObservationsB,
                            (ThresholdComparer<unsigned_long> *)&insertNdx);
      if (((ulong)local_98 & 1) == 0) {
        if (result.standardDeviations == (float)(this->m_numMaxSwaps + -1)) {
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_218,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (&local_218,
                               (char **)&sampleObservations.
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [27])": Samples with swap count ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result.standardDeviations);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])0x12825f0);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [45])
                                       " do not seem to have the same distribution:\n");
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [37])"\tDifference in standard deviations: ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_98.standardDeviations);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x12b9f11);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])"\tSwap count ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result.standardDeviations);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [10])0x12f00a8);
          pvVar4 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_40,(long)(int)result.standardDeviations);
          local_21c = linearSample<unsigned_long>(pvVar4,0.5);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_21c);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x12b9f11);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])"\tSwap count ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [10])0x12f00a8);
          pvVar4 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_40,(long)(int)result._0_4_);
          local_220 = linearSample<unsigned_long>(pvVar4,0.5);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_220);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x12b9f11);
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_218);
          this_local._4_4_ = -1;
        }
        else {
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_3a8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (&local_3a8,
                               (char **)&sampleObservations.
                                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [27])": Samples with swap count ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result.standardDeviations);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])0x12825f0);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [45])
                                       " do not seem to have the same distribution:\n");
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [26])"\tSamples with swap count ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result.standardDeviations);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [46])
                                       " are not part of the tail of stable results.\n");
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [37])"\tDifference in standard deviations: ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_98.standardDeviations);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x12b9f11);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])"\tSwap count ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result.standardDeviations);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [10])0x12f00a8);
          pvVar4 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_40,(long)(int)result.standardDeviations);
          local_3ac = linearSample<unsigned_long>(pvVar4,0.5);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3ac);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x12b9f11);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [13])"\tSwap count ");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&result);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [10])0x12f00a8);
          pvVar4 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)local_40,(long)(int)result._0_4_);
          local_3b0 = linearSample<unsigned_long>(pvVar4,0.5);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_3b0);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0x12b9f11);
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3a8);
          this_local._4_4_ = (int)result.standardDeviations + 1;
        }
        goto LAB_00c59a97;
      }
      fVar3 = (float)(result._0_4_ + 1);
    }
  } while( true );
}

Assistant:

int UploadWaitDrawCase::findStabilizationSample (deUint64 (UploadWaitDrawCase::Result::*target), const char* description)
{
	std::vector<std::vector<deUint64> >	sampleObservations(m_numMaxSwaps+1);
	ThresholdComparer<deUint64>			comparer;

	comparer.relativeThreshold = 0.15f;	// 15%
	comparer.absoluteThreshold = 100;	// (us), assumed sampling precision

	// get observations and order them

	for (int swapNdx = 0; swapNdx <= m_numMaxSwaps; ++swapNdx)
	{
		int insertNdx = 0;

		sampleObservations[swapNdx].resize(m_numSamplesPerSwap);

		for (int ndx = 0; ndx < (int)m_samples.size(); ++ndx)
			if (m_samples[ndx].numFrames == swapNdx)
				sampleObservations[swapNdx][insertNdx++] = m_results[ndx].*target;

		DE_ASSERT(insertNdx == m_numSamplesPerSwap);

		std::sort(sampleObservations[swapNdx].begin(), sampleObservations[swapNdx].end());
	}

	// find stabilization point

	for (int sampleNdx = m_numMaxSwaps-1; sampleNdx != -1; --sampleNdx )
	{
		// Distribution is equal to all following distributions
		for (int cmpTargetDistribution = sampleNdx+1; cmpTargetDistribution <= m_numMaxSwaps; ++cmpTargetDistribution)
		{
			// Stable section ends here?
			const DistributionCompareResult result = distributionCompare(sampleObservations[sampleNdx], sampleObservations[cmpTargetDistribution], comparer);
			if (!result.equal)
			{
				// Last two samples are not equal? Samples never stabilized
				if (sampleNdx == m_numMaxSwaps-1)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< description << ": Samples with swap count " << sampleNdx << " and " << cmpTargetDistribution << " do not seem to have the same distribution:\n"
						<< "\tDifference in standard deviations: " << result.standardDeviations << "\n"
						<< "\tSwap count " << sampleNdx << " median: " << linearSample(sampleObservations[sampleNdx], 0.5f) << "\n"
						<< "\tSwap count " << cmpTargetDistribution << " median: " << linearSample(sampleObservations[cmpTargetDistribution], 0.5f) << "\n"
						<< tcu::TestLog::EndMessage;
					return -1;
				}
				else
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< description << ": Samples with swap count " << sampleNdx << " and " << cmpTargetDistribution << " do not seem to have the same distribution:\n"
						<< "\tSamples with swap count " << sampleNdx << " are not part of the tail of stable results.\n"
						<< "\tDifference in standard deviations: " << result.standardDeviations << "\n"
						<< "\tSwap count " << sampleNdx << " median: " << linearSample(sampleObservations[sampleNdx], 0.5f) << "\n"
						<< "\tSwap count " << cmpTargetDistribution << " median: " << linearSample(sampleObservations[cmpTargetDistribution], 0.5f) << "\n"
						<< tcu::TestLog::EndMessage;

					return sampleNdx+1;
				}
			}
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< description << ": All samples seem to have the same distribution"
		<< tcu::TestLog::EndMessage;

	// all distributions equal
	return 0;
}